

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

Span * __thiscall tcmalloc::PageHeap::Carve(PageHeap *this,Span *span,Length n)

{
  uint uVar1;
  int iVar2;
  Span *span_00;
  Span *leftover;
  int extra;
  int old_location;
  Length n_local;
  Span *span_local;
  PageHeap *this_local;
  
  uVar1 = *(uint *)&span->field_0x28 >> 0x18 & 3;
  RemoveFromFreeList(this,span);
  *(uint *)&span->field_0x28 = *(uint *)&span->field_0x28 & 0xfcffffff;
  iVar2 = (int)span->length - (int)n;
  if (0 < iVar2) {
    span_00 = NewSpan(span->start + n,(long)iVar2);
    *(uint *)&span_00->field_0x28 = *(uint *)&span_00->field_0x28 & 0xfcffffff | uVar1 << 0x18;
    RecordSpan(this,span_00);
    PrependToFreeList(this,span_00);
    span->length = n;
    TCMalloc_PageMap2<35>::set(&this->pagemap_,(span->start + n) - 1,span);
  }
  if (uVar1 == 2) {
    CommitSpan(this,span);
  }
  return span;
}

Assistant:

Span* PageHeap::Carve(Span* span, Length n) {
  ASSERT(n > 0);
  ASSERT(span->location != Span::IN_USE);
  const int old_location = span->location;
  RemoveFromFreeList(span);
  span->location = Span::IN_USE;

  const int extra = span->length - n;
  ASSERT(extra >= 0);
  if (extra > 0) {
    Span* leftover = NewSpan(span->start + n, extra);
    leftover->location = old_location;
    RecordSpan(leftover);

    // The previous span of |leftover| was just splitted -- no need to
    // coalesce them. The next span of |leftover| was not previously coalesced
    // with |span|, i.e. is nullptr or has got location other than |old_location|.
#ifndef NDEBUG
    const PageID p = leftover->start;
    const Length len = leftover->length;
    Span* next = GetDescriptor(p+len);
    ASSERT (next == nullptr ||
            next->location == Span::IN_USE ||
            next->location != leftover->location);
#endif

    PrependToFreeList(leftover);  // Skip coalescing - no candidates possible
    span->length = n;
    pagemap_.set(span->start + n - 1, span);
  }
  ASSERT(Check());
  if (old_location == Span::ON_RETURNED_FREELIST) {
    // We need to recommit this address space.
    CommitSpan(span);
  }
  ASSERT(span->location == Span::IN_USE);
  ASSERT(span->length == n);
  ASSERT(stats_.unmapped_bytes+ stats_.committed_bytes==stats_.system_bytes);
  return span;
}